

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O1

MatrixXd * __thiscall
CppMLNN::cross_entropy
          (MatrixXd *__return_storage_ptr__,CppMLNN *this,MatrixXd *probs,MatrixXd *labels)

{
  ulong uVar1;
  double dVar2;
  long lVar3;
  char *__function;
  MatrixXd log_probs;
  void *local_80;
  long local_78;
  long local_70;
  undefined1 local_68 [16];
  variable_if_dynamic<long,__1> local_58;
  scalar_constant_op<double> local_50;
  RhsNested local_48;
  
  uVar1 = (probs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
  ;
  dVar2 = (double)(probs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_cols;
  if ((long)((ulong)dVar2 | uVar1) < 0) {
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, -1>]"
    ;
  }
  else {
    local_48._0_8_ = 0x3ddb7cdfd9d7bdbb;
    local_68._8_8_ = probs;
    local_58.m_value = uVar1;
    local_50.m_other = dVar2;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_80,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>_>
                *)local_68);
    if ((local_78 !=
         (labels->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
        ) || (lVar3 = (labels->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols, local_70 != lVar3)) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CwiseBinaryOp.h"
                    ,0x6e,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if (-1 < lVar3) {
      local_50.m_other = -1.0;
      local_58.m_value = lVar3;
      local_48.m_matrix.m_lhs = (LhsNested)&local_80;
      local_48.m_matrix.m_rhs = labels;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::PartialReduxExpr<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::internal::member_sum<double>,0>const>>
                ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::PartialReduxExpr<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::member_sum<double>,_0>_>
                  *)local_68);
      free(local_80);
      return __return_storage_ptr__;
    }
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, 1, -1>]"
    ;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,__function);
}

Assistant:

MatrixXd CppMLNN::cross_entropy(const MatrixXd& probs, const MatrixXd& labels) {
	MatrixXd log_probs = (probs.array() + pow(10, -10)).log(); // plus 10^-10 to avoid log(0)
	return MatrixXd(-1 * log_probs.cwiseProduct(labels).colwise().sum());
}